

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O2

endpoint_t * __thiscall
zmq::ctx_t::find_endpoint(endpoint_t *__return_storage_ptr__,ctx_t *this,char *addr_)

{
  iterator iVar1;
  int *piVar2;
  scoped_lock_t locker;
  allocator<char> local_41;
  scoped_lock_t local_40;
  key_type local_38;
  
  local_40._mutex = &this->_endpoints_sync;
  mutex_t::lock(local_40._mutex);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,addr_,&local_41);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_zmq::endpoint_t>_>_>
          ::find(&(this->_endpoints)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_endpoints)._M_t._M_impl.super__Rb_tree_header) {
    piVar2 = __errno_location();
    *piVar2 = 0x6f;
    __return_storage_ptr__->socket = (socket_base_t *)0x0;
    options_t::options_t(&__return_storage_ptr__->options);
  }
  else {
    endpoint_t::endpoint_t(__return_storage_ptr__,(endpoint_t *)(iVar1._M_node + 2));
    own_t::inc_seqnum(&__return_storage_ptr__->socket->super_own_t);
  }
  scoped_lock_t::~scoped_lock_t(&local_40);
  return __return_storage_ptr__;
}

Assistant:

zmq::endpoint_t zmq::ctx_t::find_endpoint (const char *addr_)
{
    scoped_lock_t locker (_endpoints_sync);

    endpoints_t::iterator it = _endpoints.find (addr_);
    if (it == _endpoints.end ()) {
        errno = ECONNREFUSED;
        endpoint_t empty = {NULL, options_t ()};
        return empty;
    }
    endpoint_t endpoint = it->second;

    //  Increment the command sequence number of the peer so that it won't
    //  get deallocated until "bind" command is issued by the caller.
    //  The subsequent 'bind' has to be called with inc_seqnum parameter
    //  set to false, so that the seqnum isn't incremented twice.
    endpoint.socket->inc_seqnum ();

    return endpoint;
}